

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O1

VerySimpleReadOnlyString __thiscall
Strings::VerySimpleReadOnlyString::dropUpTo
          (VerySimpleReadOnlyString *this,VerySimpleReadOnlyString *find,bool includeFind)

{
  uint uVar1;
  uint uVar2;
  tCharPtr pcVar3;
  size_t sVar4;
  char in_CL;
  undefined7 in_register_00000011;
  ulong uVar5;
  ulong extraout_RDX;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  VerySimpleReadOnlyString VVar12;
  
  uVar1 = find->length;
  pcVar3 = find->data;
  uVar2 = *(uint *)((long *)CONCAT71(in_register_00000011,includeFind) + 1);
  uVar5 = (ulong)uVar2;
  iVar6 = 0;
  uVar8 = 0;
  do {
    uVar10 = uVar8;
    if (uVar8 < uVar1) {
      uVar10 = uVar1;
    }
    uVar11 = 0;
    while( true ) {
      uVar9 = uVar1;
      if (uVar10 + iVar6 == uVar11) goto LAB_0010ee8c;
      if (*(char *)(*(long *)CONCAT71(in_register_00000011,includeFind) + (ulong)uVar11) !=
          pcVar3[uVar8 + uVar11]) break;
      uVar11 = uVar11 + 1;
      uVar9 = uVar8;
      if (uVar2 == uVar11) {
LAB_0010ee8c:
        uVar8 = uVar2;
        if (in_CL != '\0') {
          uVar8 = 0;
        }
        uVar7 = (ulong)(uVar8 + uVar9);
        if (uVar1 == uVar9) {
          uVar7 = 0;
        }
        uVar8 = uVar1;
        if ((uVar1 - uVar9 != 0) && (uVar8 = uVar1 - uVar9, in_CL == '\0')) {
          uVar5 = (ulong)(uVar2 + uVar9);
          uVar8 = uVar1 - (uVar2 + uVar9);
        }
        this->data = pcVar3 + uVar7;
        if (uVar8 == 0xffffffff) {
          if (pcVar3 == (tCharPtr)0x0) {
            uVar8 = 0;
          }
          else {
            sVar4 = strlen(pcVar3 + uVar7);
            uVar8 = (uint)sVar4;
            uVar5 = extraout_RDX;
          }
        }
        this->length = uVar8;
        VVar12._8_8_ = uVar5;
        VVar12.data = (tCharPtr)this;
        return VVar12;
      }
    }
    uVar8 = uVar8 + 1;
    iVar6 = iVar6 + -1;
  } while( true );
}

Assistant:

const VerySimpleReadOnlyString VerySimpleReadOnlyString::dropUpTo(const VerySimpleReadOnlyString & find, const bool includeFind) const
	{
	    const unsigned int pos = Find(find);
	    return VerySimpleReadOnlyString(pos == (unsigned int)length ? data : &data[includeFind ? pos : pos + (unsigned int)find.length],
	                                    pos == (unsigned int)length ? (unsigned int)length : (includeFind ? (unsigned int)length - pos
	                                                                  : (unsigned int)length - pos - (unsigned int)find.length));
	}